

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

Value * __thiscall GlobOptBlockData::FindObjectTypeValue(GlobOptBlockData *this,SymID typeSymId)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  Sym *this_00;
  undefined4 *puVar4;
  SymID typeSymId_local;
  GlobOptBlockData *this_local;
  
  this_00 = SymTable::Find(this->globOpt->func->m_symTable,typeSymId);
  bVar2 = Sym::IsStackSym(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x52b,"(this->globOpt->func->m_symTable->Find(typeSymId)->IsStackSym())",
                       "this->globOpt->func->m_symTable->Find(typeSymId)->IsStackSym()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(this->liveFields,typeSymId);
  if (BVar3 == '\0') {
    this_local = (GlobOptBlockData *)0x0;
  }
  else {
    this_local = (GlobOptBlockData *)FindObjectTypeValueNoLivenessCheck(this,typeSymId);
  }
  return (Value *)this_local;
}

Assistant:

Value *
GlobOptBlockData::FindObjectTypeValue(SymID typeSymId)
{
    Assert(this->globOpt->func->m_symTable->Find(typeSymId)->IsStackSym());
    if (!this->liveFields->Test(typeSymId))
    {
        return nullptr;
    }
    return FindObjectTypeValueNoLivenessCheck(typeSymId);
}